

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_inet_pton(int af,char *src,void *dst)

{
  byte bVar1;
  char *pcVar2;
  uint8_t u_1;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  int iVar9;
  long lVar10;
  in_addr *addr;
  int iVar11;
  ulong uVar12;
  byte *pbVar13;
  void *__src;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  uint d;
  uint c;
  char more_1;
  uint b;
  char more;
  uint a;
  uint local_74;
  uint local_70;
  undefined1 local_69;
  undefined8 local_68;
  uint local_5c;
  undefined4 local_58;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  byte *local_40;
  char *local_38;
  
  if (af == 10) {
    local_40 = (byte *)strchr(src,0x2e);
    if (local_40 == (byte *)src) {
      return 0;
    }
    pbVar8 = local_40;
    if (local_40 == (byte *)0x0) {
      sVar4 = strlen(src);
      pbVar13 = (byte *)(src + sVar4);
      iVar3 = 0;
    }
    else {
      do {
        pbVar13 = pbVar8;
        pbVar8 = pbVar13 + -1;
        if (pbVar8 < src) break;
      } while ((EVUTIL_ISDIGIT_TABLE[*pbVar8 >> 5] >> (*pbVar8 & 0x1f) & 1) != 0);
      iVar3 = __isoc99_sscanf(pbVar13,"%u.%u.%u.%u%c",&local_68,&local_70,&local_74,&local_5c,
                              &local_69);
      if ((iVar3 != 4) ||
         ((0xff < local_5c || 0xff < local_74) || (0xff < local_70 || 0xff < (uint)local_68))) {
        return 0;
      }
      uStack_4c = (ushort)((uint)local_68 << 8) | (ushort)local_70;
      uStack_4a = (ushort)(local_74 << 8) | (ushort)local_5c;
      iVar3 = 2;
    }
    if (pbVar13 <= src) {
      return 0;
    }
    uVar12 = 0xffffffff;
    uVar6 = 0;
    local_38 = (char *)dst;
    do {
      if (7 < (int)uVar6) {
        return 0;
      }
      bVar1 = *src;
      if ((EVUTIL_ISXDIGIT_TABLE[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0) {
        if (((bVar1 == 0x3a) && (0 < (int)uVar6)) && ((int)uVar12 == -1)) {
          src = (char *)((byte *)src + 1);
          uVar12 = (ulong)uVar6;
        }
        else {
          if (bVar1 != 0x3a) {
            return 0;
          }
          if (uVar6 != 0) {
            return 0;
          }
          if (((byte *)src)[1] != 0x3a) {
            return 0;
          }
          if ((int)uVar12 != -1) {
            return 0;
          }
          src = (char *)((byte *)src + 2);
          uVar6 = 0;
          uVar12 = 0;
        }
      }
      else {
        uVar5 = strtol(src,(char **)&local_68,0x10);
        pbVar8 = (byte *)CONCAT44(local_68._4_4_,(uint)local_68);
        if ((byte *)src + 4 < pbVar8) {
          return 0;
        }
        if (pbVar8 == (byte *)src) {
          return 0;
        }
        if (0x10000 < uVar5) {
          return 0;
        }
        lVar10 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        *(short *)((long)&local_58 + lVar10 * 2) = (short)uVar5;
        iVar3 = iVar3 + 1;
        src = (char *)(pbVar8 + 1);
        if ((pbVar8 != pbVar13) && (*pbVar8 != 0x3a)) {
          return 0;
        }
      }
      pcVar2 = local_38;
    } while (src < pbVar13);
    if (8 < iVar3) {
      return 0;
    }
    iVar11 = (int)uVar12;
    if (iVar3 == 8 && iVar11 != -1) {
      return 0;
    }
    if (iVar3 != 8 && iVar11 == -1) {
      return 0;
    }
    if (-1 < iVar11) {
      iVar9 = ((iVar3 + (uint)(local_40 == (byte *)0x0) * 2) - iVar11) + -2;
      if (iVar9 < 0) {
        return -1;
      }
      __src = (void *)((long)&local_58 + uVar12 * 2);
      memmove((void *)((long)&local_58 + (ulong)(iVar11 + (8U - iVar3)) * 2),__src,
              (ulong)(uint)(iVar9 * 2));
      memset(__src,0,(ulong)(8U - iVar3) * 2);
    }
    uVar14 = (ushort)local_58 >> 8;
    uVar15 = local_58._2_2_ >> 8;
    uVar17 = uStack_54 >> 8;
    uVar18 = uStack_52 >> 8;
    uVar20 = uStack_50 >> 8;
    uVar21 = uStack_4e >> 8;
    uVar23 = uStack_4c >> 8;
    uVar24 = uStack_4a >> 8;
    uVar16 = uStack_50 & 0xff;
    uVar19 = uStack_4e & 0xff;
    uVar22 = uStack_4c & 0xff;
    uVar25 = uStack_4a & 0xff;
    uVar26 = uStack_54 & 0xff;
    uVar27 = uStack_52 & 0xff;
    *pcVar2 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(local_58 >> 8) - (0xff < uVar14);
    pcVar2[1] = ((local_58 & 0xff) != 0) * (((ushort)local_58 & 0xff) < 0x100) * (char)local_58 -
                (0xff < ((ushort)local_58 & 0xff));
    pcVar2[2] = (uVar15 != 0) * (uVar15 < 0x100) * (char)(local_58 >> 0x18) - (0xff < uVar15);
    pcVar2[3] = ((local_58 & 0xff0000) != 0) * ((local_58._2_2_ & 0xff) < 0x100) *
                (char)(local_58 >> 0x10) - (0xff < (local_58._2_2_ & 0xff));
    pcVar2[4] = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uStack_54 >> 8) - (0xff < uVar17);
    pcVar2[5] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uStack_54 - (0xff < uVar26);
    pcVar2[6] = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uStack_52 >> 8) - (0xff < uVar18);
    pcVar2[7] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uStack_52 - (0xff < uVar27);
    pcVar2[8] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uStack_50 >> 8) - (0xff < uVar20);
    pcVar2[9] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uStack_50 - (0xff < uVar16);
    pcVar2[10] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uStack_4e >> 8) - (0xff < uVar21);
    pcVar2[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uStack_4e - (0xff < uVar19);
    pcVar2[0xc] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uStack_4c >> 8) - (0xff < uVar23);
    pcVar2[0xd] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uStack_4c - (0xff < uVar22);
    pcVar2[0xe] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uStack_4a >> 8) - (0xff < uVar24);
    pcVar2[0xf] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uStack_4a - (0xff < uVar25);
  }
  else {
    if (af != 2) {
      return -1;
    }
    iVar3 = __isoc99_sscanf(src,"%u.%u.%u.%u%c",&local_58,&local_68,&local_70,&local_74,&local_5c);
    if (iVar3 != 4) {
      return 0;
    }
    if (0xff < local_58) {
      return 0;
    }
    if (0xff < (uint)local_68) {
      return 0;
    }
    if (0xff < local_70) {
      return 0;
    }
    if (0xff < local_74) {
      return 0;
    }
    uVar6 = local_70 << 8 | local_74;
    uVar7 = uVar6 | (uint)local_68 << 0x10 | local_58 << 0x18;
    *(uint *)dst = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                   local_74 << 0x18;
  }
  return 1;
}

Assistant:

int
evutil_inet_pton(int af, const char *src, void *dst)
{
#if defined(EVENT__HAVE_INET_PTON) && !defined(USE_INTERNAL_PTON)
	return inet_pton(af, src, dst);
#else
	if (af == AF_INET) {
		unsigned a,b,c,d;
		char more;
		struct in_addr *addr = dst;
		if (sscanf(src, "%u.%u.%u.%u%c", &a,&b,&c,&d,&more) != 4)
			return 0;
		if (a > 255) return 0;
		if (b > 255) return 0;
		if (c > 255) return 0;
		if (d > 255) return 0;
		addr->s_addr = htonl((a<<24) | (b<<16) | (c<<8) | d);
		return 1;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		struct in6_addr *out = dst;
		ev_uint16_t words[8];
		int gapPos = -1, i, setWords=0;
		const char *dot = strchr(src, '.');
		const char *eow; /* end of words. */
		if (dot == src)
			return 0;
		else if (!dot)
			eow = src+strlen(src);
		else {
			unsigned byte1,byte2,byte3,byte4;
			char more;
			for (eow = dot-1; eow >= src && EVUTIL_ISDIGIT_(*eow); --eow)
				;
			++eow;

			/* We use "scanf" because some platform inet_aton()s are too lax
			 * about IPv4 addresses of the form "1.2.3" */
			if (sscanf(eow, "%u.%u.%u.%u%c",
					   &byte1,&byte2,&byte3,&byte4,&more) != 4)
				return 0;

			if (byte1 > 255 ||
			    byte2 > 255 ||
			    byte3 > 255 ||
			    byte4 > 255)
				return 0;

			words[6] = (byte1<<8) | byte2;
			words[7] = (byte3<<8) | byte4;
			setWords += 2;
		}

		i = 0;
		while (src < eow) {
			if (i > 7)
				return 0;
			if (EVUTIL_ISXDIGIT_(*src)) {
				char *next;
				long r = strtol(src, &next, 16);
				if (next > 4+src)
					return 0;
				if (next == src)
					return 0;
				if (r<0 || r>65536)
					return 0;

				words[i++] = (ev_uint16_t)r;
				setWords++;
				src = next;
				if (*src != ':' && src != eow)
					return 0;
				++src;
			} else if (*src == ':' && i > 0 && gapPos==-1) {
				gapPos = i;
				++src;
			} else if (*src == ':' && i == 0 && src[1] == ':' && gapPos==-1) {
				gapPos = i;
				src += 2;
			} else {
				return 0;
			}
		}

		if (setWords > 8 ||
			(setWords == 8 && gapPos != -1) ||
			(setWords < 8 && gapPos == -1))
			return 0;

		if (gapPos >= 0) {
			int nToMove = setWords - (dot ? 2 : 0) - gapPos;
			int gapLen = 8 - setWords;
			/* assert(nToMove >= 0); */
			if (nToMove < 0)
				return -1; /* should be impossible */
			memmove(&words[gapPos+gapLen], &words[gapPos],
					sizeof(ev_uint16_t)*nToMove);
			memset(&words[gapPos], 0, sizeof(ev_uint16_t)*gapLen);
		}
		for (i = 0; i < 8; ++i) {
			out->s6_addr[2*i  ] = words[i] >> 8;
			out->s6_addr[2*i+1] = words[i] & 0xff;
		}

		return 1;
#endif
	} else {
		return -1;
	}
#endif
}